

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,ROMAddress *addr)

{
  _Setfill<char> _Var1;
  byte bVar2;
  uint16_t uVar3;
  fmtflags __fmtfl;
  _Setw _Var4;
  ostream *poVar5;
  fmtflags flags;
  ROMAddress *addr_local;
  ostream *stream_local;
  
  __fmtfl = std::ios_base::flags((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),_S_hex);
  _Var1 = std::setfill<char>('0');
  poVar5 = std::operator<<(stream,_Var1._M_c);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::uppercase);
  _Var4 = std::setw(2);
  poVar5 = std::operator<<(poVar5,_Var4);
  bVar2 = ROMAddress::bank(addr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)bVar2);
  poVar5 = std::operator<<(poVar5,":");
  _Var4 = std::setw(4);
  poVar5 = std::operator<<(poVar5,_Var4);
  uVar3 = ROMAddress::bankAddress(addr);
  std::ostream::operator<<(poVar5,uVar3);
  std::ios_base::flags((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),__fmtfl);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream &stream, const ROMAddress &addr) {
    auto flags = stream.flags(std::ios_base::hex);
    //so the address gets shown as big-endian no matter if the system is little-, middle- or big-endian
    stream << std::setfill('0') << std::uppercase << std::setw(2) << static_cast<uint16_t>(addr.bank()) << ":" << std::setw(4) << addr.bankAddress();
    stream.flags(flags);
    return stream;
}